

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int lyp_rfn_apply_ext_(lys_refine *rfn,lys_node *target,LYEXT_SUBSTMT substmt,lys_ext *extdef)

{
  ly_ctx *ctx_00;
  lys_ext_instance *__ptr;
  LY_ERR *pLVar1;
  lys_ext_instance **pplVar2;
  char *pcVar3;
  bool bVar4;
  void *reallocated;
  lys_ext_instance *new;
  int n;
  int m;
  ly_ctx *ctx;
  lys_ext *extdef_local;
  LYEXT_SUBSTMT substmt_local;
  lys_node *target_local;
  lys_refine *rfn_local;
  
  ctx_00 = target->module->ctx;
  new._0_4_ = -1;
  new._4_4_ = -1;
  do {
    do {
      new._4_4_ = lys_ext_iter(rfn->ext,rfn->ext_size,(char)new._4_4_ + '\x01',substmt);
      if (new._4_4_ == -1) {
        while (new._0_4_ = lys_ext_iter(target->ext,target->ext_size,(char)(int)new + '\x01',substmt
                                       ), (int)new != -1) {
          if ((substmt != LYEXT_SUBSTMT_SELF) || (target->ext[(int)new]->def == extdef)) {
            lyp_ext_instance_rm(ctx_00,&target->ext,&target->ext_size,(uint8_t)(int)new);
            new._0_4_ = (int)new + -1;
          }
        }
        return 0;
      }
    } while ((substmt == LYEXT_SUBSTMT_SELF) && (rfn->ext[new._4_4_]->def != extdef));
    do {
      new._0_4_ = lys_ext_iter(target->ext,target->ext_size,(char)(int)new + '\x01',substmt);
      bVar4 = false;
      if (((int)new != -1) && (bVar4 = false, substmt == LYEXT_SUBSTMT_SELF)) {
        bVar4 = target->ext[(int)new]->def != extdef;
      }
    } while (bVar4);
    if ((int)new == -1) {
      __ptr = (lys_ext_instance *)malloc(0x28);
      if (__ptr == (lys_ext_instance *)0x0) {
        pLVar1 = ly_errno_location();
        *pLVar1 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyp_rfn_apply_ext_");
        return 1;
      }
      pplVar2 = (lys_ext_instance **)realloc(target->ext,(long)(int)(target->ext_size + 1) << 3);
      if (pplVar2 == (lys_ext_instance **)0x0) {
        pLVar1 = ly_errno_location();
        *pLVar1 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyp_rfn_apply_ext_");
        free(__ptr);
        return 1;
      }
      target->ext = pplVar2;
      target->ext_size = target->ext_size + '\x01';
      new._0_4_ = target->ext_size - 1;
      target->ext[(int)new] = __ptr;
      target->ext[(int)new]->parent = target;
      target->ext[(int)new]->parent_type = '\x01';
      target->ext[(int)new]->flags = 0;
      target->ext[(int)new]->insubstmt = (uint8_t)substmt;
    }
    else {
      lys_extension_instances_free
                (ctx_00,target->ext[(int)new]->ext,(uint)target->ext[(int)new]->ext_size);
      lydict_remove(ctx_00,target->ext[(int)new]->arg_value);
    }
    target->ext[(int)new]->def = rfn->ext[new._4_4_]->def;
    pcVar3 = lydict_insert(ctx_00,rfn->ext[new._4_4_]->arg_value,0);
    target->ext[(int)new]->arg_value = pcVar3;
    target->ext[(int)new]->ext_size = rfn->ext[new._4_4_]->ext_size;
    lys_ext_dup(target->module,rfn->ext[new._4_4_]->ext,rfn->ext[new._4_4_]->ext_size,target,
                LYEXT_PAR_NODE,&target->ext[(int)new]->ext,(unres_schema *)0x0);
    target->ext[(int)new]->insubstmt_index = rfn->ext[new._4_4_]->insubstmt_index;
  } while( true );
}

Assistant:

static int
lyp_rfn_apply_ext_(struct lys_refine *rfn, struct lys_node *target, LYEXT_SUBSTMT substmt, struct lys_ext *extdef)
{
    struct ly_ctx *ctx;
    int m, n;
    struct lys_ext_instance *new;
    void *reallocated;

    ctx = target->module->ctx; /* shortcut */

    m = n = -1;
    while ((m = lys_ext_iter(rfn->ext, rfn->ext_size, m + 1, substmt)) != -1) {
        /* refine's substatement includes extensions, copy them to the target, replacing the previous
         * substatement's extensions if any. In case of refining the extension itself, we are going to
         * replace only the same extension (pointing to the same definition) */
        if (substmt == LYEXT_SUBSTMT_SELF && rfn->ext[m]->def != extdef) {
            continue;
        }

        /* get the index of the extension to replace in the target node */
        do {
            n = lys_ext_iter(target->ext, target->ext_size, n + 1, substmt);
        } while (n != -1 && substmt == LYEXT_SUBSTMT_SELF && target->ext[n]->def != extdef);

        /* TODO cover complex extension instances
           ((struct lys_ext_instance_complex*)(target->ext[n])->module = target->module;
         */
        if (n == -1) {
            /* nothing to replace, we are going to add it - reallocate */
            new = malloc(sizeof **target->ext);
            if (!new) {
                LOGMEM;
                return EXIT_FAILURE;
            }
            reallocated = realloc(target->ext, (target->ext_size + 1) * sizeof *target->ext);
            if (!reallocated) {
                LOGMEM;
                free(new);
                return EXIT_FAILURE;
            }
            target->ext = reallocated;
            target->ext_size++;

            /* init */
            n = target->ext_size - 1;
            target->ext[n] = new;
            target->ext[n]->parent = target;
            target->ext[n]->parent_type = LYEXT_PAR_NODE;
            target->ext[n]->flags = 0;
            target->ext[n]->insubstmt = substmt;
        } else {
            /* replacing - first remove the allocated data from target */
            lys_extension_instances_free(ctx, target->ext[n]->ext, target->ext[n]->ext_size);
            lydict_remove(ctx, target->ext[n]->arg_value);
        }
        /* common part for adding and replacing */
        target->ext[n]->def = rfn->ext[m]->def;
        /* parent and parent_type do not change */
        target->ext[n]->arg_value = lydict_insert(ctx, rfn->ext[m]->arg_value, 0);
        /* flags do not change */
        target->ext[n]->ext_size = rfn->ext[m]->ext_size;
        lys_ext_dup(target->module, rfn->ext[m]->ext, rfn->ext[m]->ext_size, target, LYEXT_PAR_NODE,
                    &target->ext[n]->ext, NULL);
        /* substmt does not change, but the index must be taken from the refine */
        target->ext[n]->insubstmt_index = rfn->ext[m]->insubstmt_index;
    }

    /* remove the rest of extensions belonging to the original substatement in the target node */
    while ((n = lys_ext_iter(target->ext, target->ext_size, n + 1, substmt)) != -1) {
        if (substmt == LYEXT_SUBSTMT_SELF && target->ext[n]->def != extdef) {
            /* keep this extension */
            continue;
        }

        /* remove the item */
        lyp_ext_instance_rm(ctx, &target->ext, &target->ext_size, n);
        --n;
    }

    return EXIT_SUCCESS;
}